

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O3

int32_t icu_63::CollationBuilder::countTailoredNodes(int64_t *nodesArray,int32_t i,int32_t strength)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = 0;
  if (i != 0) {
    do {
      uVar3 = (uint)nodesArray[i];
      uVar2 = uVar3 & 3;
      if ((int)uVar2 < strength) {
        return iVar1;
      }
      if (uVar2 == strength) {
        if ((nodesArray[i] & 8U) == 0) {
          return iVar1;
        }
        iVar1 = iVar1 + 1;
      }
      i = uVar3 >> 8 & 0xfffff;
    } while (i != 0);
  }
  return iVar1;
}

Assistant:

int32_t
CollationBuilder::countTailoredNodes(const int64_t *nodesArray, int32_t i, int32_t strength) {
    int32_t count = 0;
    for(;;) {
        if(i == 0) { break; }
        int64_t node = nodesArray[i];
        if(strengthFromNode(node) < strength) { break; }
        if(strengthFromNode(node) == strength) {
            if(isTailoredNode(node)) {
                ++count;
            } else {
                break;
            }
        }
        i = nextIndexFromNode(node);
    }
    return count;
}